

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void luaG_errormsg(lua_State *L)

{
  StkId pTVar1;
  Value *pVVar2;
  StkId pTVar3;
  TValue *io2_1;
  TValue *io1_1;
  TValue *io2;
  TValue *io1;
  StkId errfunc;
  lua_State *L_local;
  
  if (L->errfunc != 0) {
    pVVar2 = (Value *)((long)&L->stack->value_ + L->errfunc);
    pTVar1 = L->top;
    pTVar3 = L->top;
    pTVar1->value_ = pTVar3[-1].value_;
    pTVar1->tt_ = pTVar3[-1].tt_;
    if ((pTVar1->tt_ & 0x8000) != 0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0x2af,"void luaG_errormsg(lua_State *)");
      }
      if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_001391e5:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0x2af,"void luaG_errormsg(lua_State *)");
      }
      if (L != (lua_State *)0x0) {
        if ((pTVar1->tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                        ,0x2af,"void luaG_errormsg(lua_State *)");
        }
        if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_001391e5;
      }
    }
    pTVar1 = L->top;
    pTVar3 = pTVar1 + -1;
    pTVar3->value_ = *pVVar2;
    pTVar1[-1].tt_ = *(LuaType *)(pVVar2 + 1);
    if ((pTVar1[-1].tt_ & 0x8000) != 0) {
      if ((pTVar1[-1].tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0x2b0,"void luaG_errormsg(lua_State *)");
      }
      if ((pTVar1[-1].tt_ & 0x7f) != (ushort)((pTVar3->value_).gc)->tt) {
LAB_00139300:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0x2b0,"void luaG_errormsg(lua_State *)");
      }
      if (L != (lua_State *)0x0) {
        if ((pTVar1[-1].tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                        ,0x2b0,"void luaG_errormsg(lua_State *)");
        }
        if ((((pTVar3->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00139300;
      }
    }
    L->top = L->top + 1;
    luaD_callnoyield(L,L->top + -2,1);
  }
  luaD_throw(L,2);
}

Assistant:

l_noret luaG_errormsg (lua_State *L) {
  if (L->errfunc != 0) {  /* is there an error handling function? */
    StkId errfunc = restorestack(L, L->errfunc);
    setobjs2s(L, L->top, L->top - 1);  /* move argument */
    setobjs2s(L, L->top - 1, errfunc);  /* push function */
    L->top++;  /* assume EXTRA_STACK */
    luaD_callnoyield(L, L->top - 2, 1);  /* call it */
  }
  luaD_throw(L, LUA_ERRRUN);
}